

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

bool __thiscall
solitaire::events::EventsProcessor::tryAddCardOnTableauPileAndCheckIfHandEmpty
          (EventsProcessor *this,PileId *id,MouseLeftButtonUpEventData *eventData)

{
  Solitaire *pSVar1;
  bool bVar2;
  PileId local_24;
  MouseLeftButtonUpEventData *local_20;
  MouseLeftButtonUpEventData *eventData_local;
  PileId *id_local;
  EventsProcessor *this_local;
  
  pSVar1 = eventData->solitaire;
  local_20 = eventData;
  eventData_local = (MouseLeftButtonUpEventData *)id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_24,id);
  (*pSVar1->_vptr_Solitaire[9])(pSVar1,&local_24);
  bVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    (local_20->cardsInHand);
  return bVar2;
}

Assistant:

bool EventsProcessor::tryAddCardOnTableauPileAndCheckIfHandEmpty(
    const PileId id, const MouseLeftButtonUpEventData& eventData) const
{
    eventData.solitaire.tryAddCardsOnTableauPile(id);
    return eventData.cardsInHand.empty();
}